

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_DoublingFactorCounterTest_NoPointsHand_Test::~TEST_DoublingFactorCounterTest_NoPointsHand_Test
          (TEST_DoublingFactorCounterTest_NoPointsHand_Test *this)

{
  TEST_DoublingFactorCounterTest_NoPointsHand_Test *mem;
  TEST_DoublingFactorCounterTest_NoPointsHand_Test *this_local;
  
  mem = this;
  ~TEST_DoublingFactorCounterTest_NoPointsHand_Test(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, NoPointsHand)
{
	addPair(Tile::SouthWind);
	addSequence(Tile::OneOfCharacters, false);
	addSequence(Tile::TwoOfCircles, false);
	addSequence(Tile::TwoOfBamboos, false);
	addSequence(Tile::SevenOfCharacters, false);

	s.winByDiscard();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::NoPointsHand));
	CHECK_EQUAL(1, r.doubling_factor);
}